

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_unsigned_int> google::protobuf::internal::ReadTagFallback(char *p,uint32 res)

{
  long lVar1;
  char *pcVar2;
  uint uVar3;
  pair<const_char_*,_unsigned_int> pVar5;
  ulong uVar4;
  
  uVar3 = ((uint)(byte)p[2] * 0x4000 + res) - 0x4000;
  uVar4 = (ulong)uVar3;
  if (p[2] < '\0') {
    uVar3 = (uVar3 + (uint)(byte)p[3] * 0x200000) - 0x200000;
    uVar4 = (ulong)uVar3;
    if (p[3] < '\0') {
      if (p[4] < '\0') {
        pcVar2 = (char *)0x0;
        uVar4 = 0;
        goto LAB_002824de;
      }
      uVar4 = (ulong)(uVar3 + (uint)(byte)p[4] * 0x10000000 + 0xf0000000);
      lVar1 = 4;
    }
    else {
      lVar1 = 3;
    }
  }
  else {
    lVar1 = 2;
  }
  pcVar2 = p + lVar1 + 1;
LAB_002824de:
  pVar5._8_8_ = uVar4;
  pVar5.first = pcVar2;
  return pVar5;
}

Assistant:

std::pair<const char*, uint32> ReadTagFallback(const char* p, uint32 res) {
  for (std::uint32_t i = 2; i < 5; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}